

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSceneCombiner.cpp
# Opt level: O3

void __thiscall
utSceneCombiner_MergeMeshes_ValidNames_Test_Test::~utSceneCombiner_MergeMeshes_ValidNames_Test_Test
          (utSceneCombiner_MergeMeshes_ValidNames_Test_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F( utSceneCombiner, MergeMeshes_ValidNames_Test ) {
    std::vector<aiMesh*> merge_list;
    aiMesh *mesh1 = new aiMesh;
    mesh1->mName.Set( "mesh_1" );
    merge_list.push_back( mesh1 );

    aiMesh *mesh2 = new aiMesh;
    mesh2->mName.Set( "mesh_2" );
    merge_list.push_back( mesh2 );

    aiMesh *mesh3 = new aiMesh;
    mesh3->mName.Set( "mesh_3" );
    merge_list.push_back( mesh3 );

    std::unique_ptr<aiMesh> out;
    aiMesh* ptr = nullptr;
    SceneCombiner::MergeMeshes( &ptr, 0, merge_list.begin(), merge_list.end() );
    out.reset(ptr);
    std::string outName = out->mName.C_Str();
    EXPECT_EQ( "mesh_1.mesh_2.mesh_3", outName );
}